

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

Expectation __thiscall
testing::internal::UntypedFunctionMockerBase::GetHandleOf
          (UntypedFunctionMockerBase *this,ExpectationBase *exp)

{
  ExpectationBase *in_RDX;
  linked_ptr_internal *extraout_RDX;
  linked_ptr_internal *extraout_RDX_00;
  linked_ptr_internal lVar1;
  linked_ptr<testing::internal::ExpectationBase> *ptr;
  Expectation EVar2;
  allocator<char> local_31;
  string local_30;
  
  ptr = *(linked_ptr<testing::internal::ExpectationBase> **)((long)&(exp->source_text_).field_2 + 8)
  ;
  do {
    if (ptr == *(linked_ptr<testing::internal::ExpectationBase> **)&exp->cardinality_specified_) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"Cannot find expectation.",&local_31);
      Assert(false,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jmossberg[P]tenniskatacpp/google/googlemock/src/gmock-spec-builders.cc"
             ,0x1ca,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      this->_vptr_UntypedFunctionMockerBase = (_func_int **)0x0;
      this->mock_obj_ = &this->mock_obj_;
      lVar1.next_ = extraout_RDX;
LAB_0012190c:
      EVar2.expectation_base_.link_.next_ = lVar1.next_;
      EVar2.expectation_base_.value_ = (ExpectationBase *)this;
      return (Expectation)EVar2.expectation_base_;
    }
    if (ptr->value_ == in_RDX) {
      linked_ptr<testing::internal::ExpectationBase>::linked_ptr
                ((linked_ptr<testing::internal::ExpectationBase> *)this,ptr);
      lVar1.next_ = extraout_RDX_00;
      goto LAB_0012190c;
    }
    ptr = ptr + 1;
  } while( true );
}

Assistant:

Expectation UntypedFunctionMockerBase::GetHandleOf(ExpectationBase* exp) {
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    if (it->get() == exp) {
      return Expectation(*it);
    }
  }

  Assert(false, __FILE__, __LINE__, "Cannot find expectation.");
  return Expectation();
  // The above statement is just to make the code compile, and will
  // never be executed.
}